

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O2

int If_LogCounterPinDelays
              (int *pTimes,int *pnTimes,word *pPinDels,int Num,word PinDel,int nSuppAll,int fXor)

{
  int iVar1;
  int iVar2;
  int t;
  word wVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = (ulong)*pnTimes;
  iVar5 = *pnTimes + 1;
  pPinDels[uVar4] = PinDel;
  pTimes[uVar4] = Num;
  if ((long)uVar4 < 1) {
LAB_0031a479:
    if (iVar5 < 1) {
      __assert_fail("nTimes > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                    ,0xe2,"int If_LogCounterPinDelays(int *, int *, word *, int, word, int, int)");
    }
    *pnTimes = iVar5;
    return (uint)(iVar5 != 1) + *pTimes;
  }
  do {
    uVar7 = uVar4 & 0xffffffff;
    while( true ) {
      iVar6 = (int)uVar7;
      if (iVar6 < 1) goto LAB_0031a479;
      iVar1 = pTimes[uVar7];
      uVar4 = (ulong)(iVar6 - 1);
      iVar2 = pTimes[uVar4];
      if (iVar1 < iVar2) goto LAB_0031a479;
      if (iVar1 <= iVar2) break;
      pTimes[uVar7] = iVar2;
      pTimes[uVar4] = iVar1;
      wVar3 = pPinDels[uVar7];
      pPinDels[uVar7] = pPinDels[uVar4];
      pPinDels[uVar4] = wVar3;
      uVar7 = (ulong)(iVar6 - 1);
    }
    pTimes[uVar4] = iVar2 + 1;
    wVar3 = If_CutPinDelayMax(pPinDels[uVar7],pPinDels[uVar4],nSuppAll,iVar2 + 1);
    pPinDels[uVar4] = wVar3;
    iVar5 = iVar5 + -1;
    uVar9 = uVar7;
    while( true ) {
      uVar8 = uVar9 + 1;
      if (iVar5 <= (int)uVar7) break;
      pTimes[uVar9] = pTimes[uVar8];
      pPinDels[uVar9] = pPinDels[uVar8];
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar9 = uVar8;
    }
  } while( true );
}

Assistant:

static inline int If_LogCounterPinDelays( int * pTimes, int * pnTimes, word * pPinDels, int Num, word PinDel, int nSuppAll, int fXor )
{
    int nTimes = *pnTimes;
    pPinDels[nTimes] = PinDel;
    pTimes[nTimes++] = Num;
    if ( nTimes > 1 )
    {
        int i, k;
        for ( k = nTimes-1; k > 0; k-- )
        {
            if ( pTimes[k] < pTimes[k-1] )
                break;
            if ( pTimes[k] > pTimes[k-1] )
            { 
                ABC_SWAP( int, pTimes[k], pTimes[k-1] ); 
                ABC_SWAP( word, pPinDels[k], pPinDels[k-1] ); 
                continue; 
            }
            pTimes[k-1] += 1 + fXor;
            pPinDels[k-1] = If_CutPinDelayMax( pPinDels[k], pPinDels[k-1], nSuppAll, 1 + fXor );
            for ( nTimes--, i = k; i < nTimes; i++ )
            {
                pTimes[i] = pTimes[i+1];
                pPinDels[i] = pPinDels[i+1];
            }
        }
    }
    assert( nTimes > 0 );
    *pnTimes = nTimes;
    return pTimes[0] + (nTimes > 1 ? 1 + fXor : 0);
}